

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall Fn_FnDef_Test::TestBody(Fn_FnDef_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_640;
  Message local_638;
  int local_630;
  uint8_t local_629;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_19;
  Message local_610;
  int local_608;
  uint8_t local_601;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_18;
  Message local_5e8;
  int local_5e0;
  uint8_t local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_17;
  Message local_5c0;
  BcOp local_5b8;
  BcOp local_5b4;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_16;
  undefined1 local_598 [4];
  BcIns ins_5;
  AssertHelper local_578;
  Message local_570;
  bool local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__5;
  Message local_548;
  int local_540;
  uint16_t local_53a;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_15;
  Message local_520;
  int local_518;
  uint8_t local_511;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_14;
  Message local_4f8;
  BcOp local_4f0;
  BcOp local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_13;
  undefined1 local_4d0 [4];
  BcIns ins_4;
  AssertHelper local_4b0;
  Message local_4a8;
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__4;
  Message local_480;
  int local_478;
  uint8_t local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_12;
  Message local_458;
  int local_450;
  uint8_t local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_11;
  Message local_430;
  int local_428;
  uint8_t local_421;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_10;
  Message local_408;
  BcOp local_400;
  BcOp local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_9;
  undefined1 local_3e0 [4];
  BcIns ins_3;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__3;
  Message local_390;
  int local_388;
  uint16_t local_382;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_8;
  Message local_368;
  int local_360;
  uint8_t local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  BcOp local_338;
  BcOp local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_318 [4];
  BcIns ins_2;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__2;
  Message local_2c8;
  int local_2c0;
  uint16_t local_2ba;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_5;
  Message local_2a0;
  int local_298;
  uint8_t local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_4;
  Message local_278;
  BcOp local_270;
  BcOp local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_250 [4];
  BcIns ins_1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__1;
  Message local_200;
  int local_1f8;
  uint16_t local_1f2;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8;
  int local_1d0;
  uint8_t local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  BcOp local_1a8;
  BcOp local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  BcIns ins;
  AssertHelper local_168;
  Message local_160 [3];
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  MockParser mock;
  Fn_FnDef_Test *this_local;
  
  MockParser::MockParser
            ((MockParser *)&gtest_ar_.message_,
             "let a = 3\nfn hello() {\n  let b = 4\n}\nlet c = 5\n");
  local_141 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ins,(internal *)local_140,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x35e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&ins);
    testing::Message::~Message(local_160);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    gtest_ar.message_.ptr_._0_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
    local_1a4 = bc_op((BcIns)gtest_ar.message_.ptr_);
    local_1a8 = BC_SET_N;
    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
              ((EqHelper<false> *)local_1a0,"bc_op(ins)","BC_SET_N",&local_1a4,&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x35e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1b0);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      local_1c9 = bc_arg1((BcIns)gtest_ar.message_.ptr_);
      local_1d0 = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                ((EqHelper<false> *)local_1c8,"bc_arg1(ins)","0",&local_1c9,&local_1d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
      if (!bVar1) {
        testing::Message::Message(&local_1d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x35e,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1d8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        local_1f2 = bc_arg16((BcIns)gtest_ar.message_.ptr_);
        local_1f8 = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                  ((EqHelper<false> *)local_1f0,"bc_arg16(ins)","0",&local_1f2,&local_1f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
        if (!bVar1) {
          testing::Message::Message(&local_200);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                     ,0x35e,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1.message_,&local_200);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_200);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          local_219 = mock.cur_fn <
                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_218,&local_219,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
          if (!bVar1) {
            testing::Message::Message(&local_228);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_250,(internal *)local_218,
                       (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                       "false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_230,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                       ,0x35f,pcVar2);
            testing::internal::AssertHelper::operator=(&local_230,&local_228);
            testing::internal::AssertHelper::~AssertHelper(&local_230);
            std::__cxx11::string::~string((string *)local_250);
            testing::Message::~Message(&local_228);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            gtest_ar_3.message_.ptr_._4_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
            local_26c = bc_op(gtest_ar_3.message_.ptr_._4_4_);
            local_270 = BC_SET_F;
            testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                      ((EqHelper<false> *)local_268,"bc_op(ins)","BC_SET_F",&local_26c,&local_270);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
            if (!bVar1) {
              testing::Message::Message(&local_278);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                         ,0x35f,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_278);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_278);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_291 = bc_arg1(gtest_ar_3.message_.ptr_._4_4_);
              local_298 = 1;
              testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                        ((EqHelper<false> *)local_290,"bc_arg1(ins)","1",&local_291,&local_298);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
              if (!bVar1) {
                testing::Message::Message(&local_2a0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                           ,0x35f,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_2a0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_2a0);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                local_2ba = bc_arg16(gtest_ar_3.message_.ptr_._4_4_);
                local_2c0 = 1;
                testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                          ((EqHelper<false> *)local_2b8,"bc_arg16(ins)","1",&local_2ba,&local_2c0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2b8);
                if (!bVar1) {
                  testing::Message::Message(&local_2c8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                             ,0x35f,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__2.message_,&local_2c8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_);
                  testing::Message::~Message(&local_2c8);
                }
                gtest_ar.message_.ptr_._5_3_ = 0;
                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                  local_2e1 = mock.cur_fn <
                              (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2e0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2f0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_318,(internal *)local_2e0,
                               (AssertionResult *)
                               "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true",
                               in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                               ,0x360,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
                    std::__cxx11::string::~string((string *)local_318);
                    testing::Message::~Message(&local_2f0);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    gtest_ar_6.message_.ptr_._4_4_ =
                         MockParser::next((MockParser *)&gtest_ar_.message_);
                    local_334 = bc_op(gtest_ar_6.message_.ptr_._4_4_);
                    local_338 = BC_SET_N;
                    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                              ((EqHelper<false> *)local_330,"bc_op(ins)","BC_SET_N",&local_334,
                               &local_338);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_330);
                    if (!bVar1) {
                      testing::Message::Message(&local_340);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_330);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                 ,0x360,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_7.message_,&local_340);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_);
                      testing::Message::~Message(&local_340);
                    }
                    gtest_ar.message_.ptr_._5_3_ = 0;
                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                      local_359 = bc_arg1(gtest_ar_6.message_.ptr_._4_4_);
                      local_360 = 2;
                      testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                ((EqHelper<false> *)local_358,"bc_arg1(ins)","2",&local_359,
                                 &local_360);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_358);
                      if (!bVar1) {
                        testing::Message::Message(&local_368);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_358);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                   ,0x360,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_8.message_,&local_368);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_);
                        testing::Message::~Message(&local_368);
                      }
                      gtest_ar.message_.ptr_._5_3_ = 0;
                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                        local_382 = bc_arg16(gtest_ar_6.message_.ptr_._4_4_);
                        local_388 = 2;
                        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                  ((EqHelper<false> *)local_380,"bc_arg16(ins)","2",&local_382,
                                   &local_388);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_380);
                        if (!bVar1) {
                          testing::Message::Message(&local_390);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_380);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                     ,0x360,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__3.message_,&local_390);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__3.message_);
                          testing::Message::~Message(&local_390);
                        }
                        gtest_ar.message_.ptr_._5_3_ = 0;
                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                          local_3a9 = mock.cur_fn <
                                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                           mock.vm._264_8_ * 0x18);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3a8);
                          if (!bVar1) {
                            testing::Message::Message(&local_3b8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_3e0,(internal *)local_3a8,
                                       (AssertionResult *)
                                       "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                                       "true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3c0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                       ,0x361,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
                            testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                            std::__cxx11::string::~string((string *)local_3e0);
                            testing::Message::~Message(&local_3b8);
                          }
                          gtest_ar.message_.ptr_._5_3_ = 0;
                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                            gtest_ar_9.message_.ptr_._4_4_ =
                                 MockParser::next((MockParser *)&gtest_ar_.message_);
                            local_3fc = bc_op(gtest_ar_9.message_.ptr_._4_4_);
                            local_400 = BC_RET;
                            testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                      ((EqHelper<false> *)local_3f8,"bc_op(ins)","BC_RET",&local_3fc
                                       ,&local_400);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_3f8);
                            if (!bVar1) {
                              testing::Message::Message(&local_408);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_3f8);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                         ,0x361,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_10.message_,&local_408);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_);
                              testing::Message::~Message(&local_408);
                            }
                            gtest_ar.message_.ptr_._5_3_ = 0;
                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8)
                            ;
                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                              local_421 = bc_arg1(gtest_ar_9.message_.ptr_._4_4_);
                              local_428 = 0;
                              testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                        ((EqHelper<false> *)local_420,"bc_arg1(ins)","0",&local_421,
                                         &local_428);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_420);
                              if (!bVar1) {
                                testing::Message::Message(&local_430);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_420);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                           ,0x361,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_11.message_,&local_430);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_);
                                testing::Message::~Message(&local_430);
                              }
                              gtest_ar.message_.ptr_._5_3_ = 0;
                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_420);
                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                local_449 = bc_arg2(gtest_ar_9.message_.ptr_._4_4_);
                                local_450 = 0;
                                testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                          ((EqHelper<false> *)local_448,"bc_arg2(ins)","0",
                                           &local_449,&local_450);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_448);
                                if (!bVar1) {
                                  testing::Message::Message(&local_458);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_448);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                             ,0x361,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_12.message_,&local_458);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_12.message_);
                                  testing::Message::~Message(&local_458);
                                }
                                gtest_ar.message_.ptr_._5_3_ = 0;
                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_448);
                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                  local_471 = bc_arg3(gtest_ar_9.message_.ptr_._4_4_);
                                  local_478 = 0;
                                  testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                            ((EqHelper<false> *)local_470,"bc_arg3(ins)","0",
                                             &local_471,&local_478);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_470);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_480);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_470);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                               ,0x361,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar__4.message_,&local_480);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar__4.message_);
                                    testing::Message::~Message(&local_480);
                                  }
                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_470);
                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                    local_499 = *(int *)(mock.vm._8_8_ + 0x28) != 0;
                                    testing::AssertionResult::AssertionResult<bool>
                                              ((AssertionResult *)local_498,&local_499,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_498);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_4a8);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)local_4d0,(internal *)local_498,
                                                 (AssertionResult *)
                                                 "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                 ,"false","true",in_R9);
                                      pcVar2 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_4b0,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                 ,0x364,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                (&local_4b0,&local_4a8);
                                      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
                                      std::__cxx11::string::~string((string *)local_4d0);
                                      testing::Message::~Message(&local_4a8);
                                    }
                                    gtest_ar.message_.ptr_._5_3_ = 0;
                                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_498);
                                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                      gtest_ar_13.message_.ptr_._4_4_ =
                                           MockParser::next((MockParser *)&gtest_ar_.message_);
                                      local_4ec = bc_op(gtest_ar_13.message_.ptr_._4_4_);
                                      local_4f0 = BC_SET_N;
                                      testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                                ((EqHelper<false> *)local_4e8,"bc_op(ins)",
                                                 "BC_SET_N",&local_4ec,&local_4f0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_4e8);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_4f8);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_4e8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x364,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_14.message_,&local_4f8)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_);
                                        testing::Message::~Message(&local_4f8);
                                      }
                                      gtest_ar.message_.ptr_._5_3_ = 0;
                                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_4e8);
                                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                        local_511 = bc_arg1(gtest_ar_13.message_.ptr_._4_4_);
                                        local_518 = 0;
                                        testing::internal::EqHelper<false>::
                                        Compare<unsigned_char,int>
                                                  ((EqHelper<false> *)local_510,"bc_arg1(ins)","0",
                                                   &local_511,&local_518);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_510);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_520);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_510);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_15.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x364,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_15.message_,
                                                     &local_520);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_15.message_);
                                          testing::Message::~Message(&local_520);
                                        }
                                        gtest_ar.message_.ptr_._5_3_ = 0;
                                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_510);
                                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                          local_53a = bc_arg16(gtest_ar_13.message_.ptr_._4_4_);
                                          local_540 = 1;
                                          testing::internal::EqHelper<false>::
                                          Compare<unsigned_short,int>
                                                    ((EqHelper<false> *)local_538,"bc_arg16(ins)",
                                                     "1",&local_53a,&local_540);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_538);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_548);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_538);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar__5.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x364,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar__5.message_,
                                                       &local_548);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar__5.message_);
                                            testing::Message::~Message(&local_548);
                                          }
                                          gtest_ar.message_.ptr_._5_3_ = 0;
                                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_538);
                                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                            local_561 = *(int *)(mock.vm._8_8_ + 0x28) != 0;
                                            testing::AssertionResult::AssertionResult<bool>
                                                      ((AssertionResult *)local_560,&local_561,
                                                       (type *)0x0);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_560);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_570);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        ((string *)local_598,(internal *)local_560,
                                                         (AssertionResult *)
                                                                                                                  
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                              pcVar2 = (char *)std::__cxx11::string::c_str();
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_578,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x365,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_578,&local_570);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_578);
                                              std::__cxx11::string::~string((string *)local_598);
                                              testing::Message::~Message(&local_570);
                                            }
                                            gtest_ar.message_.ptr_._5_3_ = 0;
                                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_560);
                                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                              gtest_ar_16.message_.ptr_._4_4_ =
                                                   MockParser::next((MockParser *)
                                                                    &gtest_ar_.message_);
                                              local_5b4 = bc_op(gtest_ar_16.message_.ptr_._4_4_);
                                              local_5b8 = BC_RET;
                                              testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                                        ((EqHelper<false> *)local_5b0,"bc_op(ins)",
                                                         "BC_RET",&local_5b4,&local_5b8);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_5b0);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_5c0);
                                                pcVar2 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_5b0);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_17.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x365,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_17.message_,
                                                           &local_5c0);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_17.message_);
                                                testing::Message::~Message(&local_5c0);
                                              }
                                              gtest_ar.message_.ptr_._5_3_ = 0;
                                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_5b0);
                                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                local_5d9 = bc_arg1(gtest_ar_16.message_.ptr_._4_4_)
                                                ;
                                                local_5e0 = 0;
                                                testing::internal::EqHelper<false>::
                                                Compare<unsigned_char,int>
                                                          ((EqHelper<false> *)local_5d8,
                                                           "bc_arg1(ins)","0",&local_5d9,&local_5e0)
                                                ;
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_5d8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_5e8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_5d8);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_18.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x365,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_18.message_,
                                                             &local_5e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_18.message_);
                                                  testing::Message::~Message(&local_5e8);
                                                }
                                                gtest_ar.message_.ptr_._5_3_ = 0;
                                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_5d8);
                                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                  local_601 = bc_arg2(gtest_ar_16.message_.ptr_.
                                                                      _4_4_);
                                                  local_608 = 0;
                                                  testing::internal::EqHelper<false>::
                                                  Compare<unsigned_char,int>
                                                            ((EqHelper<false> *)local_600,
                                                             "bc_arg2(ins)","0",&local_601,
                                                             &local_608);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_600);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_610);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_600);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_19.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x365,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_19.message_,
                                                             &local_610);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_19.message_);
                                                  testing::Message::~Message(&local_610);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_600);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_629 = bc_arg3(gtest_ar_16.message_.ptr_.
                                                                        _4_4_);
                                                    local_630 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_628,
                                                               "bc_arg3(ins)","0",&local_629,
                                                               &local_630);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_628)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_638);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_628);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_640,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x365,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_640,&local_638);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_640);
                                                  testing::Message::~Message(&local_638);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_628);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar.message_.ptr_._4_4_ = 0;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MockParser::~MockParser((MockParser *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(Fn, FnDef) {
	MockParser mock(
		"let a = 3\n"
		"fn hello() {\n"
		"  let b = 4\n"
		"}\n"
		"let c = 5\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_F, 1, 1);
	INS2(BC_SET_N, 2, 2);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_SET_N, 0, 1);
	INS(BC_RET, 0, 0, 0);
}